

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFieldValueExpression
          (Generator *this,Printer *printer,char *obj_reference,FieldDescriptor *field,
          bool use_default)

{
  CppType CVar1;
  AlphaNum *b;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field_01;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  string local_f8;
  char *obj_reference_local;
  string default_arg;
  string type;
  string cardinality;
  string with_default;
  
  b = (AlphaNum *)field;
  obj_reference_local = obj_reference;
  CVar1 = FieldDescriptor::cpp_type(field);
  bVar4 = true;
  if (CVar1 != CPPTYPE_FLOAT) {
    CVar1 = FieldDescriptor::cpp_type(field);
    bVar4 = CVar1 == CPPTYPE_DOUBLE;
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  pcVar2 = "WithDefault";
  pcVar3 = "";
  if (!use_default) {
    pcVar2 = "";
  }
  std::__cxx11::string::string((string *)&with_default,pcVar2,(allocator *)&cardinality);
  if (use_default) {
    cardinality._M_dataplus._M_p = ", ";
    cardinality._M_string_length = 2;
    (anonymous_namespace)::JSFieldDefault_abi_cxx11_
              (&local_f8,(_anonymous_namespace_ *)field,field_00);
    type._M_dataplus._M_p = local_f8._M_dataplus._M_p;
    type._M_string_length = local_f8._M_string_length;
    StrCat_abi_cxx11_(&default_arg,(protobuf *)&cardinality,(AlphaNum *)&type,b);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    std::__cxx11::string::string((string *)&default_arg,"",(allocator *)&local_f8);
  }
  if (*(int *)(field + 0x3c) == 3) {
    pcVar3 = "Repeated";
  }
  std::__cxx11::string::string((string *)&cardinality,pcVar3,(allocator *)&type);
  std::__cxx11::string::string((string *)&type,"",(allocator *)&local_f8);
  field_01 = extraout_RDX;
  if (bVar4) {
    std::__cxx11::string::assign((char *)&type);
    field_01 = extraout_RDX_00;
  }
  if (CVar1 == CPPTYPE_BOOL) {
    std::__cxx11::string::assign((char *)&type);
    field_01 = extraout_RDX_01;
  }
  if ((!bVar4) || (*(int *)(field + 0x3c) == 3 || use_default)) {
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_f8,(_anonymous_namespace_ *)field,field_01);
    io::Printer::
    Print<char[12],std::__cxx11::string,char[5],std::__cxx11::string,char[13],std::__cxx11::string,char[4],char_const*,char[6],std::__cxx11::string,char[8],std::__cxx11::string>
              (printer,
               "jspb.Message.get$cardinality$$type$Field$with_default$($obj$, $index$$default$)",
               (char (*) [12])"cardinality",&cardinality,(char (*) [5])0x3e3693,&type,
               (char (*) [13])"with_default",&with_default,(char (*) [4])0x395e05,
               &obj_reference_local,(char (*) [6])0x3a0f1a,&local_f8,(char (*) [8])0x394562,
               &default_arg);
  }
  else {
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_f8,(_anonymous_namespace_ *)field,field_01);
    io::Printer::
    Print<char[4],char_const*,char[6],std::__cxx11::string,char[8],std::__cxx11::string>
              (printer,"jspb.Message.getOptionalFloatingPointField($obj$, $index$$default$)",
               (char (*) [4])0x395e05,&obj_reference_local,(char (*) [6])0x3a0f1a,&local_f8,
               (char (*) [8])0x394562,&default_arg);
  }
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&cardinality);
  std::__cxx11::string::~string((string *)&default_arg);
  std::__cxx11::string::~string((string *)&with_default);
  return;
}

Assistant:

void Generator::GenerateFieldValueExpression(io::Printer* printer,
                                             const char* obj_reference,
                                             const FieldDescriptor* field,
                                             bool use_default) const {
  const bool is_float_or_double =
      field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT ||
      field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE;
  const bool is_boolean = field->cpp_type() == FieldDescriptor::CPPTYPE_BOOL;

  const string with_default = use_default ? "WithDefault" : "";
  const string default_arg =
      use_default ? StrCat(", ", JSFieldDefault(field)) : "";
  const string cardinality = field->is_repeated() ? "Repeated" : "";
  string type = "";
  if (is_float_or_double) {
    type = "FloatingPoint";
  }
  if (is_boolean) {
    type = "Boolean";
  }

  // Prints the appropriate function, among:
  // - getField
  // - getBooleanField
  // - getFloatingPointField => Replaced by getOptionalFloatingPointField to
  //   preserve backward compatibility.
  // - getFieldWithDefault
  // - getBooleanFieldWithDefault
  // - getFloatingPointFieldWithDefault
  // - getRepeatedField
  // - getRepeatedBooleanField
  // - getRepeatedFloatingPointField
  if (is_float_or_double && !field->is_repeated() && !use_default) {
    printer->Print(
        "jspb.Message.getOptionalFloatingPointField($obj$, "
        "$index$$default$)",
        "obj", obj_reference, "index", JSFieldIndex(field), "default",
        default_arg);
  } else {
    printer->Print(
        "jspb.Message.get$cardinality$$type$Field$with_default$($obj$, "
        "$index$$default$)",
        "cardinality", cardinality, "type", type, "with_default", with_default,
        "obj", obj_reference, "index", JSFieldIndex(field), "default",
        default_arg);
  }
}